

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_bx_excret_final_code(DisasContext_conflict1 *s)

{
  TCGContext_conflict1 *s_00;
  _Bool _Var1;
  int iVar2;
  TCGLabel *l;
  int32_t local_24;
  uint32_t min_magic;
  TCGLabel *excret_label;
  TCGContext_conflict1 *tcg_ctx;
  DisasContext_conflict1 *s_local;
  
  s_00 = s->uc->tcg_ctx;
  l = gen_new_label_aarch64(s_00);
  iVar2 = arm_dc_feature(s,0x25);
  if (iVar2 == 0) {
    local_24 = -0x1000000;
  }
  else {
    local_24 = -0x1000002;
  }
  tcg_gen_brcondi_i32_aarch64(s_00,TCG_COND_GEU,s_00->cpu_R[0xf],local_24,l);
  _Var1 = is_singlestepping(s);
  if (_Var1) {
    gen_singlestep_exception(s);
  }
  else {
    tcg_gen_exit_tb_aarch64(s_00,(TranslationBlock *)0x0,0);
  }
  gen_set_label(s_00,l);
  gen_ss_advance(s);
  gen_exception_internal(s_00,8);
  return;
}

Assistant:

static inline void gen_bx_excret_final_code(DisasContext *s)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    /* Generate the code to finish possible exception return and end the TB */
    TCGLabel *excret_label = gen_new_label(tcg_ctx);
    uint32_t min_magic;

    if (arm_dc_feature(s, ARM_FEATURE_M_SECURITY)) {
        /* Covers FNC_RETURN and EXC_RETURN magic */
        min_magic = FNC_RETURN_MIN_MAGIC;
    } else {
        /* EXC_RETURN magic only */
        min_magic = EXC_RETURN_MIN_MAGIC;
    }

    /* Is the new PC value in the magic range indicating exception return? */
    tcg_gen_brcondi_i32(tcg_ctx, TCG_COND_GEU, tcg_ctx->cpu_R[15], min_magic, excret_label);
    /* No: end the TB as we would for a DISAS_JMP */
    if (is_singlestepping(s)) {
        gen_singlestep_exception(s);
    } else {
        tcg_gen_exit_tb(tcg_ctx, NULL, 0);
    }
    gen_set_label(tcg_ctx, excret_label);
    /* Yes: this is an exception return.
     * At this point in runtime env->regs[15] and env->thumb will hold
     * the exception-return magic number, which do_v7m_exception_exit()
     * will read. Nothing else will be able to see those values because
     * the cpu-exec main loop guarantees that we will always go straight
     * from raising the exception to the exception-handling code.
     *
     * gen_ss_advance(s) does nothing on M profile currently but
     * calling it is conceptually the right thing as we have executed
     * this instruction (compare SWI, HVC, SMC handling).
     */
    gen_ss_advance(s);
    gen_exception_internal(tcg_ctx, EXCP_EXCEPTION_EXIT);
}